

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.h
# Opt level: O1

Image * __thiscall pbrt::Image::operator=(Image *this,Image *param_1)

{
  int iVar1;
  
  (this->resolution).super_Tuple2<pbrt::Point2,_int>.y =
       (param_1->resolution).super_Tuple2<pbrt::Point2,_int>.y;
  iVar1 = (param_1->resolution).super_Tuple2<pbrt::Point2,_int>.x;
  this->format = param_1->format;
  (this->resolution).super_Tuple2<pbrt::Point2,_int>.x = iVar1;
  InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&this->channelNames,&param_1->channelNames);
  (this->encoding).
  super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>.
  bits = (param_1->encoding).
         super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
         .bits;
  pstd::vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_>::operator=
            (&this->p8,&param_1->p8);
  pstd::vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_>::operator=
            (&this->p16,&param_1->p16);
  pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::operator=(&this->p32,&param_1->p32)
  ;
  return this;
}

Assistant:

Image(Allocator alloc = {})
        : p8(alloc),
          p16(alloc),
          p32(alloc),
          format(PixelFormat::U256),
          resolution(0, 0) {}